

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O1

mat4_t * mat4_ortho2(mat4_t *__return_storage_ptr__,vec2_t lb,vec2_t rt)

{
  float fVar1;
  float fVar2;
  
  fVar1 = rt.x - lb.x;
  fVar2 = rt.y - lb.y;
  __return_storage_ptr__->m[0][0] = 2.0 / fVar1;
  *(float *)((long)__return_storage_ptr__ + 4) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  __return_storage_ptr__->m[1][1] = 2.0 / fVar2;
  ((float *)((long)__return_storage_ptr__ + 0x10))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x10))[3] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[1] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[2] = -1.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[3] = 0.0;
  __return_storage_ptr__->m[3][0] = -(lb.x + rt.x) / fVar1;
  __return_storage_ptr__->m[3][1] = -(rt.y + lb.y) / fVar2;
  ((float *)((long)__return_storage_ptr__ + 0x30))[2] = -0.0;
  ((float *)((long)__return_storage_ptr__ + 0x30))[3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho2(vec2_t lb, vec2_t rt) {
    vec3_t	vl	= vec3(lb.x, lb.y, -1.0f);
    vec3_t	vr	= vec3(rt.x, rt.y,  1.0f);
    return mat4_ortho3(vl, vr);
}